

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_post_process<ncnn::post_process_log<float>>(Mat *a,float coeff,Option *opt)

{
  void *pvVar1;
  ulong uVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int _c;
  int i;
  ulong uVar7;
  float fVar8;
  Mat local_78;
  
  uVar6 = a->dims;
  uVar2 = (ulong)uVar6;
  if (uVar6 == 3) {
    uVar6 = a->c;
    uVar4 = a->h * a->w;
    if (uVar6 == 1) {
      pvVar1 = a->data;
      uVar7 = 0;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = uVar7;
      }
      for (; uVar6 = (uint)uVar2, uVar5 != uVar7; uVar7 = uVar7 + 1) {
        fVar8 = logf(*(float *)((long)pvVar1 + uVar7 * 4));
        *(float *)((long)pvVar1 + uVar7 * 4) = fVar8;
        uVar2 = extraout_RAX_01;
      }
    }
    else {
      uVar7 = 0;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = uVar7;
      }
      uVar3 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar3 = uVar7;
      }
      while( true ) {
        uVar6 = (uint)uVar2;
        _c = (int)uVar7;
        if (_c == (int)uVar3) break;
        Mat::channel(&local_78,a,_c);
        pvVar1 = local_78.data;
        Mat::~Mat(&local_78);
        uVar2 = extraout_RAX_02;
        for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
          fVar8 = logf(*(float *)((long)pvVar1 + uVar7 * 4));
          *(float *)((long)pvVar1 + uVar7 * 4) = fVar8;
          uVar2 = extraout_RAX_03;
        }
        uVar7 = (ulong)(_c + 1);
      }
    }
  }
  else if (uVar6 == 2) {
    uVar6 = a->h * a->w;
    pvVar1 = a->data;
    uVar7 = 0;
    uVar5 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar5 = uVar7;
    }
    for (; uVar6 = (uint)uVar2, uVar5 != uVar7; uVar7 = uVar7 + 1) {
      fVar8 = logf(*(float *)((long)pvVar1 + uVar7 * 4));
      *(float *)((long)pvVar1 + uVar7 * 4) = fVar8;
      uVar2 = extraout_RAX_00;
    }
  }
  else if (uVar6 == 1) {
    pvVar1 = a->data;
    uVar7 = 0;
    uVar5 = (ulong)(uint)a->w;
    if (a->w < 1) {
      uVar5 = uVar7;
    }
    for (; uVar6 = (uint)uVar2, uVar5 != uVar7; uVar7 = uVar7 + 1) {
      fVar8 = logf(*(float *)((long)pvVar1 + uVar7 * 4));
      *(float *)((long)pvVar1 + uVar7 * 4) = fVar8;
      uVar2 = extraout_RAX;
    }
  }
  return uVar6;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3)
    {
        int c = a.c;
        int size = a.w * a.h;
        if (c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                float* outptr = a.channel(q);
                for (int i = 0; i < size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }

    return 0;
}